

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall
ipx::Model::MultiplyWithScaledMatrix(Model *this,Vector *rhs,double alpha,Vector *lhs,char trans)

{
  SparseMatrix *A;
  Int j;
  long lVar1;
  double dVar2;
  
  A = &this->AI_;
  lVar1 = 0;
  if ((trans & 0xdfU) == 0x54) {
    if (this->dualized_ == false) {
      for (; lVar1 < this->num_var_; lVar1 = lVar1 + 1) {
        dVar2 = DotColumn(A,(Int)lVar1,rhs);
        lhs->_M_data[lVar1] = dVar2 * alpha + lhs->_M_data[lVar1];
      }
    }
    else {
      for (; lVar1 < this->num_constr_; lVar1 = lVar1 + 1) {
        ScatterColumn(A,(Int)lVar1,rhs->_M_data[lVar1] * alpha,lhs);
      }
    }
  }
  else if (this->dualized_ == false) {
    for (; lVar1 < this->num_var_; lVar1 = lVar1 + 1) {
      ScatterColumn(A,(Int)lVar1,rhs->_M_data[lVar1] * alpha,lhs);
    }
  }
  else {
    for (; lVar1 < this->num_constr_; lVar1 = lVar1 + 1) {
      dVar2 = DotColumn(A,(Int)lVar1,rhs);
      lhs->_M_data[lVar1] = dVar2 * alpha + lhs->_M_data[lVar1];
    }
  }
  return;
}

Assistant:

void Model::MultiplyWithScaledMatrix(const Vector& rhs, double alpha,
                                     Vector& lhs, char trans) const {
    if (trans == 't' || trans == 'T') {
        assert((Int)rhs.size() == num_constr_);
        assert((Int)lhs.size() == num_var_);
        if (dualized())
            for (Int i = 0; i < num_constr_; i++)
                ScatterColumn(AI_, i, alpha*rhs[i], lhs);
        else
            for (Int j = 0; j < num_var_; j++)
                lhs[j] += alpha * DotColumn(AI_, j, rhs);
    }
    else {
        assert((Int)rhs.size() == num_var_);
        assert((Int)lhs.size() == num_constr_);
        if (dualized())
            for (Int i = 0; i < num_constr_; i++)
                lhs[i] += alpha * DotColumn(AI_, i, rhs);
        else
            for (Int j = 0; j < num_var_; j++)
                ScatterColumn(AI_, j, alpha*rhs[j], lhs);
    }
}